

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_statusline(Curl_easy *data,connectdata *conn)

{
  int iVar1;
  bool local_21;
  SingleRequest *k;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  (data->info).httpcode = (data->req).httpcode;
  (data->info).httpversion = (uint)conn->httpversion;
  if (((data->state).httpversion == '\0') || (conn->httpversion < (data->state).httpversion)) {
    (data->state).httpversion = conn->httpversion;
  }
  if ((((data->state).resume_from != 0) && ((data->state).httpreq == HTTPREQ_GET)) &&
     ((data->req).httpcode == 0x1a0)) {
    *(ushort *)&(data->req).field_0xd8 = *(ushort *)&(data->req).field_0xd8 & 0xfff7 | 8;
  }
  if (conn->httpversion == '\n') {
    Curl_infof(data,"HTTP 1.0, assume close after body");
    Curl_conncontrol(conn,1);
  }
  else if ((conn->httpversion == '\x14') ||
          (((data->req).upgr101 == UPGR101_REQUESTED && ((data->req).httpcode == 0x65)))) {
    conn->bundle->multiuse = 2;
  }
  local_21 = false;
  if (99 < (data->req).httpcode) {
    local_21 = (data->req).httpcode < 200;
  }
  *(ushort *)&(data->req).field_0xd8 =
       (ushort)*(undefined4 *)&(data->req).field_0xd8 & 0xffef | (ushort)local_21 << 4;
  iVar1 = (data->req).httpcode;
  if (iVar1 != 0xcc) {
    if (iVar1 != 0x130) {
      return CURLE_OK;
    }
    if ((data->set).timecondition != CURL_TIMECOND_NONE) {
      (data->info).field_0xe4 = (data->info).field_0xe4 & 0xfe | 1;
    }
  }
  (data->req).size = 0;
  (data->req).maxdownload = 0;
  *(ushort *)&(data->req).field_0xd8 = *(ushort *)&(data->req).field_0xd8 & 0xffef | 0x10;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_statusline(struct Curl_easy *data,
                              struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;
  data->info.httpcode = k->httpcode;

  data->info.httpversion = conn->httpversion;
  if(!data->state.httpversion ||
     data->state.httpversion > conn->httpversion)
    /* store the lowest server version we encounter */
    data->state.httpversion = conn->httpversion;

  /*
   * This code executes as part of processing the header.  As a
   * result, it's not totally clear how to interpret the
   * response code yet as that depends on what other headers may
   * be present.  401 and 407 may be errors, but may be OK
   * depending on how authentication is working.  Other codes
   * are definitely errors, so give up here.
   */
  if(data->state.resume_from && data->state.httpreq == HTTPREQ_GET &&
     k->httpcode == 416) {
    /* "Requested Range Not Satisfiable", just proceed and
       pretend this is no error */
    k->ignorebody = TRUE; /* Avoid appending error msg to good data. */
  }

  if(conn->httpversion == 10) {
    /* Default action for HTTP/1.0 must be to close, unless
       we get one of those fancy headers that tell us the
       server keeps it open for us! */
    infof(data, "HTTP 1.0, assume close after body");
    connclose(conn, "HTTP/1.0 close after body");
  }
  else if(conn->httpversion == 20 ||
          (k->upgr101 == UPGR101_REQUESTED && k->httpcode == 101)) {
    DEBUGF(infof(data, "HTTP/2 found, allow multiplexing"));
    /* HTTP/2 cannot avoid multiplexing since it is a core functionality
       of the protocol */
    conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  }
  else if(conn->httpversion >= 11 &&
          !conn->bits.close) {
    /* If HTTP version is >= 1.1 and connection is persistent */
    DEBUGF(infof(data,
                 "HTTP 1.1 or later with persistent connection"));
  }

  k->http_bodyless = k->httpcode >= 100 && k->httpcode < 200;
  switch(k->httpcode) {
  case 304:
    /* (quote from RFC2616, section 10.3.5): The 304 response
     * MUST NOT contain a message-body, and thus is always
     * terminated by the first empty line after the header
     * fields.  */
    if(data->set.timecondition)
      data->info.timecond = TRUE;
    /* FALLTHROUGH */
  case 204:
    /* (quote from RFC2616, section 10.2.5): The server has
     * fulfilled the request but does not need to return an
     * entity-body ... The 204 response MUST NOT include a
     * message-body, and thus is always terminated by the first
     * empty line after the header fields. */
    k->size = 0;
    k->maxdownload = 0;
    k->http_bodyless = TRUE;
    break;
  default:
    break;
  }
  return CURLE_OK;
}